

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  undefined8 *puVar1;
  int in_EAX;
  long lVar2;
  long lVar3;
  
  if (0 < ncomp) {
    lVar2 = (ulong)(uint)ncomp * 0x20;
    lVar3 = 0;
    do {
      if (*(long *)((long)&z->img_comp[0].raw_data + lVar3) != 0) {
        lVar2 = SDL_free();
        puVar1 = (undefined8 *)((long)&z->img_comp[0].data + lVar3);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      if (*(long *)((long)&z->img_comp[0].raw_coeff + lVar3) != 0) {
        lVar2 = SDL_free();
        *(undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar3) = 0;
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar3) = 0;
      }
      if (*(long *)((long)&z->img_comp[0].linebuf + lVar3) != 0) {
        lVar2 = SDL_free();
        *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar3) = 0;
      }
      in_EAX = (int)lVar2;
      lVar3 = lVar3 + 0x60;
    } while ((ulong)(uint)ncomp * 0x60 != lVar3);
  }
  return in_EAX;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}